

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogMessage local_68;
  Voidify local_55 [20];
  byte local_41;
  LogMessage local_40;
  Voidify local_29;
  Extension *local_28;
  Extension *extension;
  int local_18;
  int index2_local;
  int index1_local;
  int number_local;
  ExtensionSet *this_local;
  
  extension._4_4_ = index2;
  local_18 = index1;
  index2_local = number;
  _index1_local = this;
  local_28 = FindOrNull(this,number);
  local_41 = 0;
  if (local_28 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x39f,"extension != nullptr");
    local_41 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
  }
  if ((local_41 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  if (((local_28->is_repeated ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x3a0,"extension->is_repeated");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_55,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  CVar1 = anon_unknown_59::cpp_type(local_28->type);
  switch(CVar1) {
  case CPPTYPE_INT32:
    RepeatedField<int>::SwapElements
              ((RepeatedField<int> *)local_28->field_0,local_18,extension._4_4_);
    break;
  case CPPTYPE_INT64:
    RepeatedField<long>::SwapElements
              ((RepeatedField<long> *)local_28->field_0,local_18,extension._4_4_);
    break;
  case CPPTYPE_UINT32:
    RepeatedField<unsigned_int>::SwapElements
              ((RepeatedField<unsigned_int> *)local_28->field_0,local_18,extension._4_4_);
    break;
  case CPPTYPE_UINT64:
    RepeatedField<unsigned_long>::SwapElements
              ((RepeatedField<unsigned_long> *)local_28->field_0,local_18,extension._4_4_);
    break;
  case CPPTYPE_DOUBLE:
    RepeatedField<double>::SwapElements
              ((RepeatedField<double> *)local_28->field_0,local_18,extension._4_4_);
    break;
  case CPPTYPE_FLOAT:
    RepeatedField<float>::SwapElements
              ((RepeatedField<float> *)local_28->field_0,local_18,extension._4_4_);
    break;
  case CPPTYPE_BOOL:
    RepeatedField<bool>::SwapElements
              ((RepeatedField<bool> *)local_28->field_0,local_18,extension._4_4_);
    break;
  case CPPTYPE_ENUM:
    RepeatedField<int>::SwapElements
              ((RepeatedField<int> *)local_28->field_0,local_18,extension._4_4_);
    break;
  case CPPTYPE_STRING:
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::SwapElements((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_28->field_0,local_18,extension._4_4_);
    break;
  case CPPTYPE_MESSAGE:
    RepeatedPtrField<google::protobuf::MessageLite>::SwapElements
              ((RepeatedPtrField<google::protobuf::MessageLite> *)local_28->field_0,local_18,
               extension._4_4_);
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->ptr.repeated_int32_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->ptr.repeated_int64_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->ptr.repeated_uint32_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->ptr.repeated_uint64_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->ptr.repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->ptr.repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->ptr.repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->ptr.repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->ptr.repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->ptr.repeated_message_value->SwapElements(index1, index2);
      break;
  }
}